

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock-posix.c
# Opt level: O1

pboolean p_rwlock_reader_lock(PRWLock *lock)

{
  int iVar1;
  pboolean pVar2;
  
  if (lock == (PRWLock *)0x0) {
    pVar2 = 0;
  }
  else {
    iVar1 = pthread_rwlock_rdlock((pthread_rwlock_t *)lock);
    if (iVar1 == 0) {
      pVar2 = 1;
    }
    else {
      pVar2 = 0;
      printf("** Error: %s **\n","PRWLock::p_rwlock_reader_lock: pthread_rwlock_rdlock() failed");
    }
  }
  return pVar2;
}

Assistant:

P_LIB_API pboolean
p_rwlock_reader_lock (PRWLock *lock)
{
	if (P_UNLIKELY (lock == NULL))
		return FALSE;

	if (P_UNLIKELY (pthread_rwlock_rdlock (&lock->hdl) == 0))
		return TRUE;
	else {
		P_ERROR ("PRWLock::p_rwlock_reader_lock: pthread_rwlock_rdlock() failed");
		return FALSE;
	}
}